

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

int __thiscall AggressiveBotStrategy::attackFromCountryIndex(AggressiveBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  Country *pCVar4;
  pointer ppCVar5;
  Country *pCVar6;
  Country *pCVar7;
  ulong uVar8;
  long lVar9;
  pointer ppCVar10;
  ulong uVar11;
  pointer ppCVar12;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar3 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 == ppCVar3) {
    (this->super_PlayerStrategy).from = (Country *)0x0;
  }
  else {
    pCVar6 = (Country *)0x0;
    ppCVar10 = ppCVar2;
    do {
      pCVar4 = *ppCVar10;
      pCVar7 = pCVar4;
      if ((pCVar6 != (Country *)0x0) &&
         (pCVar7 = pCVar6, *pCVar6->pNumberOfTroops < *pCVar4->pNumberOfTroops)) {
        ppCVar12 = (pCVar4->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppCVar5 = (pCVar4->pAdjCountries->
                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppCVar12 != ppCVar5) {
          do {
            if (*(*ppCVar12)->pPlayerOwnerId != *pCVar4->pPlayerOwnerId) {
              pCVar6 = pCVar4;
            }
            ppCVar12 = ppCVar12 + 1;
            pCVar7 = pCVar6;
          } while (ppCVar12 != ppCVar5);
        }
      }
      ppCVar10 = ppCVar10 + 1;
      pCVar6 = pCVar7;
    } while (ppCVar10 != ppCVar3);
    (this->super_PlayerStrategy).from = pCVar7;
    if (ppCVar2 != ppCVar3) {
      lVar9 = (long)ppCVar3 - (long)ppCVar2 >> 3;
      uVar8 = 0xffffffff;
      uVar11 = 0;
      do {
        if (*ppCVar2[uVar11]->cyID == *pCVar7->cyID) {
          uVar8 = uVar11 & 0xffffffff;
        }
        uVar11 = uVar11 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != uVar11);
      return (int)uVar8;
    }
  }
  return -1;
}

Assistant:

int AggressiveBotStrategy::attackFromCountryIndex() {
    unsigned int fromCountryIndex = -1;
    Map::Country* biggestCountry = nullptr;
    for (auto* country : *player->getOwnedCountries()) {
        if (biggestCountry == nullptr) {
            biggestCountry = country;
        } else if (biggestCountry->getNumberOfTroops() < country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() != country->getPlayerOwnerID()) {
                    biggestCountry = country;
                }
            }
        }
    }

    from = biggestCountry;
    for (unsigned long i = 0; i < player->getOwnedCountries()->size(); i++) {
        if (player->getOwnedCountries()->at(i)->getCountryId() == biggestCountry->getCountryId()) {
            fromCountryIndex = i;
        }
    }

    return (int) fromCountryIndex;
}